

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_equivalence_test.h
# Opt level: O1

ostream * libaom_test::operator<<
                    (ostream *os,
                    FuncParam<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_int,_int,_int)>
                    *p)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"bit_depth:",10);
  poVar1 = (ostream *)std::ostream::operator<<(os,p->bit_depth);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," function:",10);
  poVar1 = std::ostream::_M_insert<void_const*>(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," function:",10);
  poVar1 = std::ostream::_M_insert<void_const*>(poVar1);
  return poVar1;
}

Assistant:

std::ostream &operator<<(std::ostream &os, const FuncParam<T> &p) {
  return os << "bit_depth:" << p.bit_depth
            << " function:" << reinterpret_cast<const void *>(p.ref_func)
            << " function:" << reinterpret_cast<const void *>(p.tst_func);
}